

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O1

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Render
          (CCommandProcessorFragment_OpenGL *this,CRenderCommand *pCommand)

{
  int iVar1;
  undefined8 uVar2;
  
  SetState(this,&pCommand->m_State);
  glVertexPointer(2,0x1406,0x24,pCommand->m_pVertices);
  glTexCoordPointer(3,0x1406,0x24,&pCommand->m_pVertices->m_Tex);
  glColorPointer(4,0x1406,0x24,&pCommand->m_pVertices->m_Color);
  glEnableClientState(0x8074);
  glEnableClientState(0x8078);
  glEnableClientState(0x8076);
  if (pCommand->m_PrimType == 1) {
    iVar1 = pCommand->m_PrimCount * 2;
    uVar2 = 1;
  }
  else {
    if (pCommand->m_PrimType != 2) {
      dbg_msg("render","unknown primtype %d\n",(ulong)(pCommand->super_CCommand).m_Cmd);
      return;
    }
    iVar1 = pCommand->m_PrimCount << 2;
    uVar2 = 7;
  }
  glDrawArrays(uVar2,0,iVar1);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Render(const CCommandBuffer::CRenderCommand *pCommand)
{
	SetState(pCommand->m_State);

	glVertexPointer(2, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices);
	glTexCoordPointer(3, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices + sizeof(float)*2);
	glColorPointer(4, GL_FLOAT, sizeof(CCommandBuffer::CVertex), (char*)pCommand->m_pVertices + sizeof(float)*5);
	glEnableClientState(GL_VERTEX_ARRAY);
	glEnableClientState(GL_TEXTURE_COORD_ARRAY);
	glEnableClientState(GL_COLOR_ARRAY);

	switch(pCommand->m_PrimType)
	{
	case CCommandBuffer::PRIMTYPE_QUADS:
		glDrawArrays(GL_QUADS, 0, pCommand->m_PrimCount*4);
		break;
	case CCommandBuffer::PRIMTYPE_LINES:
		glDrawArrays(GL_LINES, 0, pCommand->m_PrimCount*2);
		break;
	default:
		dbg_msg("render", "unknown primtype %d\n", pCommand->m_Cmd);
	};
}